

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

void __thiscall
CVmObjGramProd::load_alts(CVmObjGramProd *this,vm_obj_id_t self,CVmStream *src,CVmObjFixup *fixups)

{
  byte *pbVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  uint uVar7;
  uint uVar8;
  vmgram_alt_info *this_00;
  char *pcVar9;
  vm_prop_id_t *pvVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  vmgram_tok_info *pvVar15;
  
  clear_alts(this);
  pbVar1 = (byte *)((this->super_CVmObject).ext_ + 0x14);
  *pbVar1 = *pbVar1 & 0xfb;
  uVar3 = (*src->_vptr_CVmStream[6])(src);
  ensure_alts(this,(ulong)uVar3,0);
  if (uVar3 != 0) {
    uVar14 = 0;
    do {
      iVar4 = (*src->_vptr_CVmStream[5])(src);
      iVar5 = (*src->_vptr_CVmStream[5])(src);
      vVar6 = (*src->_vptr_CVmStream[8])(src);
      uVar7 = (*src->_vptr_CVmStream[6])(src);
      if (fixups != (CVmObjFixup *)0x0) {
        vVar6 = CVmObjFixup::get_new_id(fixups,vVar6);
      }
      this_00 = (vmgram_alt_info *)operator_new(0x20);
      vmgram_alt_info::vmgram_alt_info(this_00,(ulong)uVar7);
      this_00->score = iVar4;
      this_00->badness = iVar5;
      this_00->proc_obj = vVar6;
      plVar2 = (long *)((this->super_CVmObject).ext_ + 0x38);
      *plVar2 = *plVar2 + 1;
      *(vmgram_alt_info **)(*(long *)((this->super_CVmObject).ext_ + 0x30) + uVar14 * 8) = this_00;
      if (uVar7 != 0) {
        pvVar15 = this_00->toks;
        uVar13 = 0;
        do {
          iVar4 = (*src->_vptr_CVmStream[6])(src);
          pvVar15->prop = (vm_prop_id_t)iVar4;
          uVar8 = (*src->_vptr_CVmStream[3])(src);
          pvVar15->typ = (uchar)uVar8;
          switch(uVar8 & 0xff) {
          case 1:
            vVar6 = (*src->_vptr_CVmStream[8])(src);
            (pvVar15->typinfo).prod_obj = vVar6;
            if (fixups != (CVmObjFixup *)0x0) {
              vVar6 = CVmObjFixup::get_new_id(fixups,vVar6);
              (pvVar15->typinfo).prod_obj = vVar6;
            }
            break;
          case 2:
            iVar4 = (*src->_vptr_CVmStream[6])(src);
            (pvVar15->typinfo).speech_prop = (vm_prop_id_t)iVar4;
            break;
          case 3:
            uVar8 = (*src->_vptr_CVmStream[6])(src);
            uVar11 = (ulong)uVar8;
            pvVar15->typ = '\x03';
            (pvVar15->typinfo).lit.len = uVar11;
            (pvVar15->typinfo).lit.hash = 0;
            pcVar9 = (char *)malloc(uVar11);
            (pvVar15->typinfo).lit.str = pcVar9;
            (*src->_vptr_CVmStream[0xe])(src,pcVar9,uVar11);
            break;
          case 4:
            vVar6 = (*src->_vptr_CVmStream[8])(src);
            (pvVar15->typinfo).prod_obj = vVar6;
            break;
          case 6:
            uVar8 = (*src->_vptr_CVmStream[6])(src);
            uVar11 = (ulong)uVar8;
            pvVar15->typ = '\x06';
            (pvVar15->typinfo).nspeech.cnt = uVar11;
            pvVar10 = (vm_prop_id_t *)malloc(uVar11 * 2);
            (pvVar15->typinfo).nspeech.props = pvVar10;
            if (uVar8 != 0) {
              uVar12 = 0;
              do {
                iVar4 = (*src->_vptr_CVmStream[6])(src);
                (pvVar15->typinfo).nspeech.props[uVar12] = (vm_prop_id_t)iVar4;
                uVar12 = uVar12 + 1;
              } while (uVar11 != uVar12);
            }
          }
          uVar13 = uVar13 + 1;
          pvVar15 = pvVar15 + 1;
        } while (uVar13 != uVar7);
        if (((uVar7 != 0) && (this_00->toks->typ == '\x01')) &&
           ((this_00->toks->typinfo).prod_obj == self)) {
          pbVar1 = (byte *)((this->super_CVmObject).ext_ + 0x14);
          *pbVar1 = *pbVar1 | 4;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar3);
  }
  return;
}

Assistant:

void CVmObjGramProd::load_alts(VMG_ vm_obj_id_t self,
                               CVmStream *src, CVmObjFixup *fixups)
{
    /* delete any existing alternative list */
    clear_alts();

    /* presume there will be no circular alternatives */
    get_ext()->has_circular_alt = FALSE;

    /* read the number of alternatives */
    size_t alt_cnt = src->read_uint2();

    /* ensure there's room for the new list */
    ensure_alts(alt_cnt, 0);

    /* load the alternatives */
    for (size_t i = 0 ; i < alt_cnt ; ++i)
    {
        /* read the alternative header */
        int score = src->read_int2();
        int badness = src->read_int2();
        vm_obj_id_t proc_obj = (vm_obj_id_t)src->read_uint4();
        uint tokcnt = src->read_uint2();

        /* fix up the processor object ID */
        if (fixups != 0)
            proc_obj = fixups->get_new_id(vmg_ proc_obj);

        /* create this alternative */
        vmgram_alt_info *alt = new vmgram_alt_info(tokcnt);
        alt->score = score;
        alt->badness = badness;
        alt->proc_obj = proc_obj;

        /* add it to the list in our extension */
        get_ext()->alt_cnt_ += 1;
        get_ext()->alts_[i] = alt;

        /* get the first token */
        vmgram_tok_info *tok = alt->toks;

        /* read the tokens */
        for (size_t j = 0 ; j < tokcnt ; ++j, ++tok)
        {
            /* read the fixed part of the token */
            tok->prop = (vm_prop_id_t)src->read_uint2();
            tok->typ = (vmgram_match_type)src->read_byte();

            /* read the extra data according to the token type */
            switch (tok->typ)
            {
            case VMGRAM_MATCH_PROD:
                /* read the object ID */
                tok->typinfo.prod_obj = (vm_obj_id_t)src->read_uint4();

                /* fix it up if necessary */
                if (fixups != 0)
                    tok->typinfo.prod_obj = fixups->get_new_id(
                        vmg_ tok->typinfo.prod_obj);
                break;

            case VMGRAM_MATCH_SPEECH:
                /* read the part-of-speech property */
                tok->typinfo.speech_prop = (vm_prop_id_t)src->read_uint2();
                break;

            case VMGRAM_MATCH_NSPEECH:
                /* array of part-of-speech properties */
                {
                    /* read the count */
                    size_t propcnt = src->read_uint2();

                    /* allocate the array */
                    tok->set_nspeech(propcnt);

                    /* read the properties */
                    for (size_t k = 0 ; k < propcnt ; ++k)
                    {
                        tok->typinfo.nspeech.props[k] =
                            (vm_prop_id_t)src->read_uint2();
                    }
                }
                break;

            case VMGRAM_MATCH_LITERAL:
                /* literal string */
                {
                    /* read the length */
                    size_t len = src->read_uint2();

                    /* allocate the string */
                    tok->set_literal(len);

                    /* read the string */
                    src->read_bytes(tok->typinfo.lit.str, len);
                }
                break;

            case VMGRAM_MATCH_TOKTYPE:
                /* token type */
                tok->typinfo.toktyp_enum = src->read_uint4();
                break;

            case VMGRAM_MATCH_STAR:
                /* star - no additional data */
                break;
            }
        }
        
        /* 
         *   If the first token of the alternative is a recursive reference
         *   to this production itself, we have a circular reference.  Note
         *   this, since we have to handle it specially when parsing. 
         */
        tok = alt->toks;
        if (tokcnt != 0
            && tok->typ == VMGRAM_MATCH_PROD
            && tok->typinfo.prod_obj == self)
        {
            /* note the existence of a circular reference */
            get_ext()->has_circular_alt = TRUE;
        }
    }
}